

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_arg.c
# Opt level: O0

err_t cmdArgCreate(int *argc,char ***argv,char *args)

{
  int iVar1;
  blob_t pvVar2;
  size_t sVar3;
  char *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int pos;
  size_t count;
  wordexp_t we [1];
  undefined4 uVar4;
  long local_40;
  char *in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd0;
  err_t local_4;
  
  iVar1 = wordexp(in_RDX,(wordexp_t *)&stack0xffffffffffffffc8,0);
  if (iVar1 == 0) {
    *in_RSI = 0;
    *in_RDI = (int)in_stack_ffffffffffffffc8;
    if (*in_RDI == 0) {
      wordfree((wordexp_t *)&stack0xffffffffffffffc8);
      local_4 = 0;
    }
    else {
      uVar4 = 0;
      for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
        strLen((char *)0x103f89);
      }
      pvVar2 = blobCreate(CONCAT44(iVar1,uVar4));
      *in_RSI = (long)pvVar2;
      if (pvVar2 == (blob_t)0x0) {
        wordfree((wordexp_t *)&stack0xffffffffffffffc8);
        local_4 = 0x6e;
      }
      else {
        local_40 = (long)*in_RDI << 3;
        for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
          *(long *)(*in_RSI + (long)iVar1 * 8) = *in_RSI + local_40;
          strCopy((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          sVar3 = strLen((char *)0x104051);
          local_40 = sVar3 + 1 + local_40;
        }
        wordfree((wordexp_t *)&stack0xffffffffffffffc8);
        local_4 = 0;
      }
    }
  }
  else if (iVar1 == 1) {
    local_4 = 0x6e;
  }
  else {
    local_4 = 0x25b;
  }
  return local_4;
}

Assistant:

err_t cmdArgCreate(int* argc, char*** argv, const char* args)
{
	wordexp_t we[1];
	size_t count;
	int pos;
	// входной контроль
	ASSERT(strIsValid(args));
	ASSERT(memIsDisjoint2(argc, sizeof(int), argv, sizeof(char**)));
	// разбить args на строки широких символов
	switch (wordexp(args, we, 0))
	{
	case 0:
		break;
	case WRDE_NOSPACE:
		return ERR_OUTOFMEMORY;
	default:
		return ERR_CMD_PARAMS;
	}
	*argv = 0, *argc = we->we_wordc;
	// обработать отсутствие аргументов
	if (*argc == 0)
	{
		wordfree(we);
		return ERR_OK;
	}
	// перенести аргументы в блоб
	count = (size_t)(*argc) * sizeof(char*);
	for (pos = 0; pos < *argc; ++pos)
		count += strLen(we->we_wordv[pos]) + 1;
	if (!(*argv = blobCreate(count)))
	{
		wordfree(we);
		return ERR_OUTOFMEMORY;
	}
	count = (size_t)(*argc) * sizeof(char*);
	for (pos = 0; pos < *argc; ++pos)
	{
		(*argv)[pos] = (char*)*argv + count;
		strCopy((*argv)[pos], we->we_wordv[pos]);
		count += strLen((*argv)[pos]) + 1;
	}
	// завершить
	wordfree(we);
	return ERR_OK;
}